

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O2

void Synthesis(double *f0,int f0_length,double **spectrogram,double **aperiodicity,int fft_size,
              double frame_period,int fs,int y_length,double *y)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  int i_1;
  int iVar6;
  uint uVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  double *yi;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  ulong uVar18;
  double *yi_00;
  double *pdVar19;
  void *pvVar20;
  void *pvVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  int i_8;
  int iVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  fft_plan *pfVar31;
  ulong uVar32;
  undefined8 *puVar33;
  int i_2;
  long lVar34;
  ulong uVar35;
  int i;
  ulong uVar36;
  ulong uVar37;
  byte bVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double interpolation;
  double dVar48;
  fft_plan in_stack_fffffffffffffcf8;
  double local_2b8;
  RandnState randn_state;
  InverseRealFFT inverse_real_fft;
  ForwardRealFFT forward_real_fft;
  MinimumPhaseAnalysis minimum_phase;
  
  bVar38 = 0;
  randn_state.g_randn_x = 0;
  randn_state.g_randn_y = 0;
  randn_state.g_randn_z = 0;
  randn_state.g_randn_w = 0;
  randn_reseed(&randn_state);
  lVar8 = (long)fft_size;
  uVar32 = lVar8 * 8;
  if (fft_size < 0) {
    uVar32 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar32);
  uVar10 = 0;
  uVar29 = 0;
  if (0 < y_length) {
    uVar29 = (ulong)(uint)y_length;
  }
  for (; uVar29 != uVar10; uVar10 = uVar10 + 1) {
    y[uVar10] = 0.0;
  }
  uVar36 = 0;
  memset(&minimum_phase,0,0xb0);
  InitializeMinimumPhaseAnalysis(fft_size,&minimum_phase);
  inverse_real_fft.inverse_fft.ip = (int *)0x0;
  inverse_real_fft.inverse_fft.w = (double *)0x0;
  inverse_real_fft.inverse_fft.out = (double *)0x0;
  inverse_real_fft.inverse_fft.input = (double *)0x0;
  inverse_real_fft.inverse_fft.in = (double *)0x0;
  inverse_real_fft.inverse_fft.c_out = (fft_complex *)0x0;
  inverse_real_fft.inverse_fft.flags = 0;
  inverse_real_fft.inverse_fft._12_4_ = 0;
  inverse_real_fft.inverse_fft.c_in = (fft_complex *)0x0;
  inverse_real_fft.spectrum = (fft_complex *)0x0;
  inverse_real_fft.inverse_fft.n = 0;
  inverse_real_fft.inverse_fft.sign = 0;
  inverse_real_fft.fft_size = 0;
  inverse_real_fft._4_4_ = 0;
  inverse_real_fft.waveform = (double *)0x0;
  InitializeInverseRealFFT(fft_size,&inverse_real_fft);
  forward_real_fft.forward_fft.ip = (int *)0x0;
  forward_real_fft.forward_fft.w = (double *)0x0;
  forward_real_fft.forward_fft.out = (double *)0x0;
  forward_real_fft.forward_fft.input = (double *)0x0;
  forward_real_fft.forward_fft.in = (double *)0x0;
  forward_real_fft.forward_fft.c_out = (fft_complex *)0x0;
  forward_real_fft.forward_fft.flags = 0;
  forward_real_fft.forward_fft._12_4_ = 0;
  forward_real_fft.forward_fft.c_in = (fft_complex *)0x0;
  forward_real_fft.spectrum = (fft_complex *)0x0;
  forward_real_fft.forward_fft.n = 0;
  forward_real_fft.forward_fft.sign = 0;
  forward_real_fft.fft_size = 0;
  forward_real_fft._4_4_ = 0;
  forward_real_fft.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size,&forward_real_fft);
  lVar25 = (long)y_length;
  uVar10 = lVar25 * 8;
  if (y_length < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  uVar18 = lVar25 * 4;
  if (y_length < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  pvVar12 = operator_new__(uVar18);
  pvVar13 = operator_new__(uVar10);
  yi = (double *)operator_new__(uVar10);
  pdVar14 = (double *)operator_new__(uVar10);
  uVar22 = f0_length + 1;
  uVar18 = (ulong)uVar22 * 8;
  if (f0_length < -1) {
    uVar18 = 0xffffffffffffffff;
  }
  pdVar15 = (double *)operator_new__(uVar18);
  pdVar16 = (double *)operator_new__(uVar18);
  pdVar17 = (double *)operator_new__(uVar18);
  dVar4 = (double)fs;
  for (; uVar29 != uVar36; uVar36 = uVar36 + 1) {
    pdVar14[uVar36] = (double)(int)uVar36 / dVar4;
  }
  dVar46 = frame_period / 1000.0;
  uVar18 = 0;
  uVar36 = 0;
  if (0 < f0_length) {
    uVar36 = (ulong)(uint)f0_length;
  }
  for (; uVar36 != uVar18; uVar18 = uVar18 + 1) {
    pdVar15[uVar18] = (double)(int)uVar18 * dVar46;
    dVar43 = (double)(~-(ulong)(f0[uVar18] < (double)(fs / fft_size) + 1.0) & (ulong)f0[uVar18]);
    pdVar16[uVar18] = dVar43;
    pdVar17[uVar18] = (double)(~-(ulong)(dVar43 == 0.0) & 0x3ff0000000000000);
  }
  pdVar15[f0_length] = (double)f0_length * dVar46;
  iVar23 = f0_length + -1;
  pdVar16[f0_length] =
       (pdVar16[(long)f0_length + -1] + pdVar16[(long)f0_length + -1]) -
       pdVar16[(long)f0_length + -2];
  pdVar17[f0_length] =
       (pdVar17[(long)f0_length + -1] + pdVar17[(long)f0_length + -1]) -
       pdVar17[(long)f0_length + -2];
  yi_00 = (double *)operator_new__(uVar10);
  interp1(pdVar15,pdVar16,uVar22,pdVar14,y_length,yi_00);
  interp1(pdVar15,pdVar17,uVar22,pdVar14,y_length,yi);
  for (uVar10 = 0; uVar29 != uVar10; uVar10 = uVar10 + 1) {
    dVar44 = (double)(-(ulong)(0.5 < yi[uVar10]) & 0x3ff0000000000000);
    yi[uVar10] = dVar44;
    dVar43 = 500.0;
    if ((dVar44 != 0.0) || (NAN(dVar44))) {
      dVar43 = yi_00[uVar10];
    }
    yi_00[uVar10] = dVar43;
  }
  uVar22 = y_length - 1;
  uVar10 = (ulong)(uint)y_length << 3;
  if (y_length < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  uVar29 = (ulong)uVar22 * 8;
  if (y_length < 1) {
    uVar29 = 0xffffffffffffffff;
  }
  pdVar19 = (double *)operator_new__(uVar10);
  pvVar20 = operator_new__(uVar29);
  local_2b8 = (*yi_00 * 6.283185307179586) / dVar4;
  dVar43 = fmod(local_2b8,6.283185307179586);
  uVar39 = SUB84(dVar43,0);
  uVar40 = (undefined4)((ulong)dVar43 >> 0x20);
  *pdVar19 = dVar43;
  for (lVar34 = 1; lVar34 < lVar25; lVar34 = lVar34 + 1) {
    dVar43 = (double)CONCAT44(uVar40,uVar39);
    local_2b8 = local_2b8 + (yi_00[lVar34] * 6.283185307179586) / dVar4;
    dVar44 = fmod(local_2b8,6.283185307179586);
    uVar39 = SUB84(dVar44,0);
    uVar40 = (undefined4)((ulong)dVar44 >> 0x20);
    pdVar19[lVar34] = dVar44;
    *(double *)((long)pvVar20 + lVar34 * 8 + -8) = ABS(dVar44 - dVar43);
  }
  uVar29 = 0;
  uVar10 = (ulong)uVar22;
  if ((int)uVar22 < 1) {
    uVar10 = uVar29;
  }
  uVar22 = 0;
  for (; uVar10 != uVar29; uVar29 = uVar29 + 1) {
    if (3.141592653589793 < *(double *)((long)pvVar20 + uVar29 * 8)) {
      lVar25 = (long)(int)uVar22;
      *(double *)((long)pvVar11 + lVar25 * 8) = pdVar14[uVar29];
      *(int *)((long)pvVar12 + lVar25 * 4) = (int)uVar29;
      *(double *)((long)pvVar13 + lVar25 * 8) =
           (-(pdVar19[uVar29] + -6.283185307179586) /
           (pdVar19[uVar29 + 1] - (pdVar19[uVar29] + -6.283185307179586))) / dVar4;
      uVar22 = uVar22 + 1;
    }
  }
  operator_delete__(pvVar20);
  operator_delete__(pdVar19);
  operator_delete__(pdVar17);
  operator_delete__(pdVar16);
  operator_delete__(pdVar15);
  operator_delete__(pdVar14);
  operator_delete__(yi_00);
  pvVar20 = operator_new__(uVar32);
  dVar43 = (double)fft_size;
  iVar6 = (int)((long)fft_size / 2);
  uVar10 = 0;
  if (0 < iVar6) {
    uVar10 = (long)fft_size / 2 & 0xffffffff;
  }
  dVar44 = 0.0;
  uVar29 = 0;
  iVar27 = fft_size;
  while (iVar27 = iVar27 + -1, uVar10 != uVar29) {
    dVar48 = cos(((double)(int)(uVar29 + 1) * 6.283185307179586) / (dVar43 + 1.0));
    dVar48 = dVar48 * -0.5 + 0.5;
    *(double *)((long)pvVar20 + uVar29 * 8) = dVar48;
    *(double *)((long)pvVar20 + (long)iVar27 * 8) = dVar48;
    dVar48 = *(double *)((long)pvVar20 + uVar29 * 8);
    dVar44 = dVar44 + dVar48 + dVar48;
    uVar29 = uVar29 + 1;
  }
  iVar27 = fft_size;
  for (uVar29 = 0; iVar27 = iVar27 + -1, uVar10 != uVar29; uVar29 = uVar29 + 1) {
    dVar48 = *(double *)((long)pvVar20 + uVar29 * 8) / dVar44;
    *(double *)((long)pvVar20 + uVar29 * 8) = dVar48;
    *(double *)((long)pvVar20 + (long)iVar27 * 8) = dVar48;
  }
  iVar27 = -1;
  if (-1 < iVar6) {
    iVar27 = iVar6;
  }
  uVar36 = (ulong)(iVar27 + 1);
  uVar29 = 0;
  if (0 < fft_size) {
    uVar29 = (ulong)(uint)fft_size;
  }
  uVar18 = (ulong)uVar22;
  if ((int)uVar22 < 1) {
    uVar18 = 0;
  }
  lVar25 = uVar36 << 4;
  uVar30 = 0;
  while (uVar30 != uVar18) {
    uVar1 = uVar30 + 1;
    iVar27 = (int)uVar1;
    if ((int)(uVar22 - 1) < iVar27) {
      iVar27 = uVar22 - 1;
    }
    iVar27 = *(int *)((long)pvVar12 + (long)iVar27 * 4);
    iVar3 = *(int *)((long)pvVar12 + uVar30 * 4);
    dVar44 = yi[iVar3];
    dVar48 = *(double *)((long)pvVar11 + uVar30 * 8);
    dVar2 = *(double *)((long)pvVar13 + uVar30 * 8);
    pdVar14 = (double *)operator_new__(uVar32);
    pdVar15 = (double *)operator_new__(uVar32);
    pvVar21 = operator_new__(uVar32);
    pdVar16 = (double *)operator_new__(uVar32);
    dVar48 = dVar48 / dVar46;
    dVar45 = floor(dVar48);
    iVar28 = (int)dVar45;
    if (iVar23 < (int)dVar45) {
      iVar28 = iVar23;
    }
    dVar45 = ceil(dVar48);
    iVar26 = (int)dVar45;
    if (iVar23 < (int)dVar45) {
      iVar26 = iVar23;
    }
    dVar48 = dVar48 - (double)iVar28;
    if (iVar28 == iVar26) {
      for (uVar30 = 0; uVar36 != uVar30; uVar30 = uVar30 + 1) {
        *(double *)((long)pvVar21 + uVar30 * 8) = ABS(spectrogram[iVar28][uVar30]);
      }
    }
    else {
      for (uVar30 = 0; uVar36 != uVar30; uVar30 = uVar30 + 1) {
        *(double *)((long)pvVar21 + uVar30 * 8) =
             ABS(spectrogram[iVar28][uVar30]) * (1.0 - dVar48) +
             ABS(spectrogram[iVar26][uVar30]) * dVar48;
      }
    }
    if (iVar28 == iVar26) {
      for (uVar30 = 0; uVar36 != uVar30; uVar30 = uVar30 + 1) {
        uVar39 = 0xffffdcd1;
        uVar40 = 0x3fefffff;
        dVar48 = aperiodicity[iVar28][uVar30];
        if (dVar48 <= 0.999999999999) {
          uVar39 = SUB84(dVar48,0);
          uVar40 = (undefined4)((ulong)dVar48 >> 0x20);
        }
        uVar41 = 0xd2f1a9fc;
        uVar42 = 0x3f50624d;
        if (0.001 <= (double)CONCAT44(uVar40,uVar39)) {
          uVar41 = uVar39;
          uVar42 = uVar40;
        }
        pdVar16[uVar30] = (double)CONCAT44(uVar42,uVar41) * (double)CONCAT44(uVar42,uVar41);
      }
    }
    else {
      for (uVar30 = 0; uVar36 != uVar30; uVar30 = uVar30 + 1) {
        uVar39 = 0xffffdcd1;
        uVar40 = 0x3fefffff;
        dVar45 = aperiodicity[iVar28][uVar30];
        if (dVar45 <= 0.999999999999) {
          uVar39 = SUB84(dVar45,0);
          uVar40 = (undefined4)((ulong)dVar45 >> 0x20);
        }
        dVar45 = 0.001;
        if (0.001 <= (double)CONCAT44(uVar40,uVar39)) {
          dVar45 = (double)CONCAT44(uVar40,uVar39);
        }
        uVar39 = 0xffffdcd1;
        uVar40 = 0x3fefffff;
        dVar47 = aperiodicity[iVar26][uVar30];
        if (dVar47 <= 0.999999999999) {
          uVar39 = SUB84(dVar47,0);
          uVar40 = (undefined4)((ulong)dVar47 >> 0x20);
        }
        dVar47 = 0.001;
        if (0.001 <= (double)CONCAT44(uVar40,uVar39)) {
          dVar47 = (double)CONCAT44(uVar40,uVar39);
        }
        dVar45 = dVar47 * dVar48 + dVar45 * (1.0 - dVar48);
        pdVar16[uVar30] = dVar45 * dVar45;
      }
    }
    if ((dVar44 <= 0.5) || (0.999 < *pdVar16)) {
      for (uVar30 = 0; uVar29 != uVar30; uVar30 = uVar30 + 1) {
        pdVar15[uVar30] = 0.0;
      }
    }
    else {
      for (lVar34 = 0; lVar34 <= minimum_phase.fft_size / 2; lVar34 = lVar34 + 1) {
        dVar48 = log((1.0 - pdVar16[lVar34]) * *(double *)((long)pvVar21 + lVar34 * 8) + 1e-12);
        minimum_phase.log_spectrum[lVar34] = dVar48 * 0.5;
      }
      GetMinimumPhaseSpectrum(&minimum_phase);
      for (lVar34 = 0; lVar25 != lVar34; lVar34 = lVar34 + 0x10) {
        *(undefined8 *)((long)*inverse_real_fft.spectrum + lVar34) =
             *(undefined8 *)((long)*minimum_phase.minimum_phase_spectrum + lVar34);
        *(undefined8 *)((long)*inverse_real_fft.spectrum + lVar34 + 8) =
             *(undefined8 *)((long)*minimum_phase.minimum_phase_spectrum + lVar34 + 8);
      }
      iVar28 = 0;
      for (lVar34 = 0; lVar25 != lVar34; lVar34 = lVar34 + 0x10) {
        pdVar17 = (double *)((long)*inverse_real_fft.spectrum + lVar34);
        dVar47 = *pdVar17;
        dVar5 = pdVar17[1];
        dVar48 = cos((double)iVar28 * ((dVar2 * 6.283185307179586 * dVar4) / dVar43));
        dVar45 = 1.0 - dVar48 * dVar48;
        if (dVar45 < 0.0) {
          dVar45 = sqrt(dVar45);
        }
        else {
          dVar45 = SQRT(dVar45);
        }
        pdVar17 = (double *)((long)*inverse_real_fft.spectrum + lVar34);
        *pdVar17 = dVar48 * dVar47 + dVar45 * dVar5;
        pdVar17[1] = dVar48 * dVar5 + dVar45 * -dVar47;
        iVar28 = iVar28 + 1;
      }
      pfVar31 = &inverse_real_fft.inverse_fft;
      puVar33 = (undefined8 *)&stack0xfffffffffffffcf8;
      for (lVar34 = 9; lVar34 != 0; lVar34 = lVar34 + -1) {
        *puVar33 = *(undefined8 *)pfVar31;
        pfVar31 = (fft_plan *)((long)pfVar31 + (ulong)bVar38 * -0x10 + 8);
        puVar33 = puVar33 + (ulong)bVar38 * -2 + 1;
      }
      fft_execute(in_stack_fffffffffffffcf8);
      fftshift(inverse_real_fft.waveform,fft_size,pdVar15);
      dVar48 = 0.0;
      for (lVar34 = (long)iVar6; lVar34 < lVar8; lVar34 = lVar34 + 1) {
        dVar48 = dVar48 + pdVar15[lVar34];
      }
      for (uVar30 = 0; lVar34 = (long)iVar6, uVar10 != uVar30; uVar30 = uVar30 + 1) {
        pdVar15[uVar30] = *(double *)((long)pvVar20 + uVar30 * 8) * -dVar48;
      }
      for (; lVar34 < lVar8; lVar34 = lVar34 + 1) {
        pdVar15[lVar34] = *(double *)((long)pvVar20 + lVar34 * 8) * -dVar48 + pdVar15[lVar34];
      }
    }
    uVar37 = (long)iVar27 - (long)iVar3;
    uVar30 = 0;
    if (0 < (int)uVar37) {
      uVar30 = uVar37 & 0xffffffff;
    }
    dVar48 = 0.0;
    for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 1) {
      dVar2 = randn(&randn_state);
      forward_real_fft.waveform[uVar35] = dVar2;
      dVar48 = dVar48 + dVar2;
    }
    dVar2 = (double)(int)uVar37;
    for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 1) {
      forward_real_fft.waveform[uVar35] = forward_real_fft.waveform[uVar35] - dVar48 / dVar2;
    }
    for (; (long)uVar37 < lVar8; uVar37 = uVar37 + 1) {
      forward_real_fft.waveform[uVar37] = 0.0;
    }
    pfVar31 = &forward_real_fft.forward_fft;
    puVar33 = (undefined8 *)&stack0xfffffffffffffcf8;
    for (lVar34 = 9; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar33 = *(undefined8 *)pfVar31;
      pfVar31 = (fft_plan *)((long)pfVar31 + (ulong)bVar38 * -0x10 + 8);
      puVar33 = puVar33 + (ulong)bVar38 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffcf8);
    if ((dVar44 != 0.0) || (NAN(dVar44))) {
      for (lVar34 = 0; lVar34 <= minimum_phase.fft_size / 2; lVar34 = lVar34 + 1) {
        dVar44 = log(*(double *)((long)pvVar21 + lVar34 * 8) * pdVar16[lVar34]);
        minimum_phase.log_spectrum[lVar34] = dVar44 * 0.5;
      }
    }
    else {
      for (lVar34 = 0; lVar34 <= minimum_phase.fft_size / 2; lVar34 = lVar34 + 1) {
        dVar44 = log(*(double *)((long)pvVar21 + lVar34 * 8));
        minimum_phase.log_spectrum[lVar34] = dVar44 * 0.5;
      }
    }
    GetMinimumPhaseSpectrum(&minimum_phase);
    for (lVar34 = 0; lVar25 != lVar34; lVar34 = lVar34 + 0x10) {
      *(double *)((long)*inverse_real_fft.spectrum + lVar34) =
           *(double *)((long)*minimum_phase.minimum_phase_spectrum + lVar34) *
           *(double *)((long)*forward_real_fft.spectrum + lVar34) -
           *(double *)((long)*forward_real_fft.spectrum + lVar34 + 8) *
           *(double *)((long)*minimum_phase.minimum_phase_spectrum + lVar34 + 8);
      *(double *)((long)*inverse_real_fft.spectrum + lVar34 + 8) =
           *(double *)((long)*minimum_phase.minimum_phase_spectrum + lVar34) *
           *(double *)((long)*forward_real_fft.spectrum + lVar34 + 8) +
           *(double *)((long)*minimum_phase.minimum_phase_spectrum + lVar34 + 8) *
           *(double *)((long)*forward_real_fft.spectrum + lVar34);
    }
    pfVar31 = &inverse_real_fft.inverse_fft;
    puVar33 = (undefined8 *)&stack0xfffffffffffffcf8;
    for (lVar34 = 9; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar33 = *(undefined8 *)pfVar31;
      pfVar31 = (fft_plan *)((long)pfVar31 + (ulong)bVar38 * -0x10 + 8);
      puVar33 = puVar33 + (ulong)bVar38 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffcf8);
    fftshift(inverse_real_fft.waveform,fft_size,pdVar14);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    for (uVar30 = 0; uVar29 != uVar30; uVar30 = uVar30 + 1) {
      *(double *)((long)pvVar9 + uVar30 * 8) = (pdVar15[uVar30] * dVar2 + pdVar14[uVar30]) / dVar43;
    }
    operator_delete__(pvVar21);
    operator_delete__(pdVar16);
    operator_delete__(pdVar15);
    operator_delete__(pdVar14);
    uVar24 = iVar3 + fft_size / -2;
    uVar7 = 0xffffffff;
    if ((int)uVar24 < -1) {
      uVar7 = uVar24;
    }
    uVar37 = (ulong)~uVar7;
    iVar27 = ~uVar24 + y_length;
    if (fft_size < (int)(~uVar24 + y_length)) {
      iVar27 = fft_size;
    }
    for (; uVar30 = uVar1, (long)uVar37 < (long)iVar27; uVar37 = uVar37 + 1) {
      y[(long)(int)uVar24 + uVar37 + 1] =
           *(double *)((long)pvVar9 + uVar37 * 8) + y[(long)(int)uVar24 + uVar37 + 1];
    }
  }
  operator_delete__(pvVar20);
  operator_delete__(pvVar11);
  operator_delete__(pvVar12);
  operator_delete__(pvVar13);
  operator_delete__(yi);
  DestroyMinimumPhaseAnalysis(&minimum_phase);
  DestroyInverseRealFFT(&inverse_real_fft);
  DestroyForwardRealFFT(&forward_real_fft);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void Synthesis(const double *f0, int f0_length,
    const double * const *spectrogram, const double * const *aperiodicity,
    int fft_size, double frame_period, int fs, int y_length, double *y) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double *impulse_response = new double[fft_size];

  for (int i = 0; i < y_length; ++i) y[i] = 0.0;

  MinimumPhaseAnalysis minimum_phase = {0};
  InitializeMinimumPhaseAnalysis(fft_size, &minimum_phase);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);
  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);

  double *pulse_locations = new double[y_length];
  int *pulse_locations_index = new int[y_length];
  double *pulse_locations_time_shift = new double[y_length];
  double *interpolated_vuv = new double[y_length];
  int number_of_pulses = GetTimeBase(f0, f0_length, fs, frame_period / 1000.0,
      y_length, fs / fft_size + 1.0, pulse_locations, pulse_locations_index,
      pulse_locations_time_shift, interpolated_vuv);

  double *dc_remover = new double[fft_size];
  GetDCRemover(fft_size, dc_remover);

  frame_period /= 1000.0;
  int noise_size;
  int index, offset, lower_limit, upper_limit;
  for (int i = 0; i < number_of_pulses; ++i) {
    noise_size = pulse_locations_index[MyMinInt(number_of_pulses - 1, i + 1)] -
      pulse_locations_index[i];

    GetOneFrameSegment(interpolated_vuv[pulse_locations_index[i]], noise_size,
        spectrogram, fft_size, aperiodicity, f0_length, frame_period,
        pulse_locations[i], pulse_locations_time_shift[i], fs,
        &forward_real_fft, &inverse_real_fft, &minimum_phase, dc_remover,
        impulse_response, &randn_state);
    offset = pulse_locations_index[i] - fft_size / 2 + 1;
    lower_limit = MyMaxInt(0, -offset);
    upper_limit = MyMinInt(fft_size, y_length - offset);
    for (int j = lower_limit; j < upper_limit; ++j) {
      index = j + offset;
      y[index] += impulse_response[j];
    }
  }

  delete[] dc_remover;
  delete[] pulse_locations;
  delete[] pulse_locations_index;
  delete[] pulse_locations_time_shift;
  delete[] interpolated_vuv;

  DestroyMinimumPhaseAnalysis(&minimum_phase);
  DestroyInverseRealFFT(&inverse_real_fft);
  DestroyForwardRealFFT(&forward_real_fft);

  delete[] impulse_response;
}